

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O2

string * __thiscall glTF2::Buffer::GetURI_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&(this->super_Object).id);
  std::operator+(__return_storage_ptr__,&local_30,".bin");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GetURI()
            { return std::string(this->id) + ".bin"; }